

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract.c
# Opt level: O2

ErrorNumber test_abstract(void)

{
  TA_ParamHolder *param;
  ErrorNumber EVar1;
  TA_RetCode TVar2;
  uint uVar3;
  int *piVar4;
  char *pcVar5;
  double *pdVar6;
  int iVar7;
  undefined8 uVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  double dVar12;
  ErrorNumber errNumber;
  TA_ParamHolder *paramHolder;
  TA_FuncHandle *handle;
  
  puts("Testing Abstract interface");
  EVar1 = allocLib();
  if (EVar1 != TA_TEST_PASS) {
    return EVar1;
  }
  TVar2 = TA_GetFuncHandle("STOCH",&handle);
  if (TVar2 != TA_SUCCESS) {
    printf("Can\'t get the function handle [%d]\n",(ulong)TVar2);
    return TA_ABS_TST_FAIL_GETFUNCHANDLE;
  }
  TVar2 = TA_ParamHolderAlloc(handle,&paramHolder);
  param = paramHolder;
  if (TVar2 != TA_SUCCESS) {
    printf("Can\'t allocate the param holder [%d]\n",(ulong)TVar2);
    return TA_ABS_TST_FAIL_PARAMHOLDERALLOC;
  }
  TVar2 = TA_SetOptInputParamInteger(paramHolder,0,3);
  if ((((TVar2 == TA_SUCCESS) &&
       (TVar2 = TA_SetOptInputParamInteger(param,1,4), TVar2 == TA_SUCCESS)) &&
      (TVar2 = TA_SetOptInputParamInteger(param,2,0), TVar2 == TA_SUCCESS)) &&
     ((TVar2 = TA_SetOptInputParamInteger(param,3,4), TVar2 == TA_SUCCESS &&
      (TVar2 = TA_SetOptInputParamInteger(param,4,0), TVar2 == TA_SUCCESS)))) {
    TVar2 = TA_GetLookback(param,(TA_Integer *)&errNumber);
    if (TVar2 != TA_SUCCESS) {
      printf("TA_GetLookback failed [%d]\n",(ulong)TVar2);
      uVar8 = 0x260;
      goto LAB_0011d79c;
    }
    if (errNumber != TA_REGTEST_HISTORYALLOC_3) {
      printf("TA_GetLookback failed [%d != 8]\n");
      uVar8 = 0x262;
      goto LAB_0011d79c;
    }
    TVar2 = TA_SetOptInputParamInteger(param,3,3);
    if (TVar2 == TA_SUCCESS) {
      TVar2 = TA_GetLookback(param,(TA_Integer *)&errNumber);
      if (TVar2 == TA_SUCCESS) {
        if (errNumber == TA_REGTEST_HISTORYALLOC_2) {
          TVar2 = TA_ParamHolderFree(paramHolder);
          if (TVar2 != TA_SUCCESS) {
            printf("TA_ParamHolderFree failed [%d]\n",(ulong)TVar2);
            return TA_ABS_TST_FAIL_PARAMHOLDERFREE;
          }
          EVar1 = freeLib();
          if (EVar1 != TA_TEST_PASS) {
            return EVar1;
          }
          EVar1 = allocLib();
          if (EVar1 != TA_TEST_PASS) {
            return EVar1;
          }
          errNumber = TA_TEST_PASS;
          piVar4 = inputNegData_int;
          pdVar6 = inputNegData;
          iVar7 = 0;
          for (lVar9 = 0; lVar9 != 100; lVar9 = lVar9 + 1) {
            *pdVar6 = -(double)(int)lVar9;
            *piVar4 = iVar7;
            piVar4 = piVar4 + 1;
            pdVar6 = pdVar6 + 1;
            iVar7 = iVar7 + -1;
          }
          pdVar6 = inputZeroData;
          for (lVar9 = 0; lVar9 != 400; lVar9 = lVar9 + 4) {
            *pdVar6 = 0.0;
            *(undefined4 *)((long)inputZeroData_int + lVar9) = 0;
            pdVar6 = pdVar6 + 1;
          }
          for (lVar9 = 0; lVar9 != 2000; lVar9 = lVar9 + 1) {
            do {
              do {
                iVar7 = rand();
                dVar12 = (double)iVar7 * 4.656612873077393e-10;
              } while (dVar12 <= 0.0);
            } while (1.0 <= dVar12);
            inputRandomData[lVar9] = dVar12;
            inputRandomData_int[lVar9] = (int)dVar12;
          }
          pdVar6 = inputRandFltEpsilon;
          for (lVar9 = 0; lVar9 != 400; lVar9 = lVar9 + 4) {
            uVar3 = rand();
            bVar11 = (uVar3 & 1) == 0;
            *pdVar6 = *(double *)(&DAT_00182250 + (ulong)bVar11 * 8);
            *(uint *)((long)inputRandFltEpsilon_int + lVar9) = (uint)!bVar11 * 2 + 0x7fffffff;
            pdVar6 = pdVar6 + 1;
          }
          pdVar6 = inputRandFltEpsilon;
          for (lVar9 = 0; lVar9 != 400; lVar9 = lVar9 + 4) {
            uVar3 = rand();
            bVar11 = (uVar3 & 1) == 0;
            *pdVar6 = *(double *)(&DAT_00182260 + (ulong)bVar11 * 8);
            *(uint *)((long)inputRandFltEpsilon_int + lVar9) = -(uint)bVar11 | 1;
            pdVar6 = pdVar6 + 1;
          }
          if (doExtensiveProfiling != 0) {
            puts("\n[PROFILING START]");
          }
          TA_ForEachFunc(testDefault,&errNumber);
          if (doExtensiveProfiling != 0) {
            puts("[PROFILING END]");
          }
          EVar1 = errNumber;
          if (errNumber == TA_TEST_PASS) {
            EVar1 = freeLib();
            if (EVar1 != TA_TEST_PASS) {
              return EVar1;
            }
            uVar10 = 0;
            pcVar5 = TA_FunctionDescriptionXML();
            while( true ) {
              if (uVar10 == 1000000) {
                puts("TA_FunctionDescriptionXML failed. Size too large (missing null?).");
                return TA_ABS_TST_FAIL_FUNCTION_DESC_LARGE;
              }
              if (pcVar5[uVar10] == '\0') break;
              uVar10 = uVar10 + 1;
            }
            if (499 < uVar10) {
              return TA_TEST_PASS;
            }
            puts("TA_FunctionDescriptionXML failed. Size too small.");
            return TA_ABS_TST_FAIL_FUNCTION_DESC_SMALL;
          }
          puts("TA-Abstract default call failed");
          return EVar1;
        }
        printf("TA_GetLookback failed [%d != 7]\n");
        uVar8 = 0x263;
      }
      else {
        printf("TA_GetLookback failed [%d]\n",(ulong)TVar2);
        uVar8 = 0x261;
      }
      goto LAB_0011d79c;
    }
  }
  printf("TA_SetOptInputParamInteger call failed [%d]\n",(ulong)TVar2);
  uVar8 = 0x25d;
LAB_0011d79c:
  printf("testLookback() failed [%d]\n",uVar8);
  TA_ParamHolderFree(paramHolder);
  return (ErrorNumber)uVar8;
}

Assistant:

ErrorNumber test_abstract( void )
{
   ErrorNumber retValue;
   TA_RetCode retCode;
   TA_ParamHolder *paramHolder;
   const TA_FuncHandle *handle;
   int i;
   const char *xmlArray;

   printf( "Testing Abstract interface\n" );

   retValue = allocLib();
   if( retValue != TA_TEST_PASS )
      return retValue;

   /* Verify TA_GetLookback. */
   retCode = TA_GetFuncHandle( "STOCH", &handle );
   if( retCode != TA_SUCCESS )
   {
      printf( "Can't get the function handle [%d]\n", retCode );
      return TA_ABS_TST_FAIL_GETFUNCHANDLE;
   }

   retCode = TA_ParamHolderAlloc( handle, &paramHolder );
   if( retCode != TA_SUCCESS )
   {
      printf( "Can't allocate the param holder [%d]\n", retCode );
      return TA_ABS_TST_FAIL_PARAMHOLDERALLOC;
   }

   retValue = testLookback(paramHolder);
   if( retValue != TA_SUCCESS )
   {
      printf( "testLookback() failed [%d]\n", retValue );
      TA_ParamHolderFree( paramHolder );
      return retValue;
   }

   retCode = TA_ParamHolderFree( paramHolder );
   if( retCode != TA_SUCCESS )
   {
      printf( "TA_ParamHolderFree failed [%d]\n", retCode );
      return TA_ABS_TST_FAIL_PARAMHOLDERFREE;
   }

   retValue = freeLib();
   if( retValue != TA_TEST_PASS )
      return retValue;

   /* Call all the TA functions through the abstract interface. */
   retValue = allocLib();
   if( retValue != TA_TEST_PASS )
      return retValue;

   retValue = test_default_calls();
   if( retValue != TA_TEST_PASS )
   {
      printf( "TA-Abstract default call failed\n" );
      return retValue;
   }

   retValue = freeLib();
   if( retValue != TA_TEST_PASS )
      return retValue;

   /* Verify that the TA_FunctionDescription is null terminated
    * and as at least 500 characters (less is guaranteed bad...)
    */
   xmlArray = TA_FunctionDescriptionXML();
   for( i=0; i < 1000000; i++ )
   {
      if( xmlArray[i] == 0x0 )
         break;
   }

   if( i < 500)
   {
      printf( "TA_FunctionDescriptionXML failed. Size too small.\n" );
      return TA_ABS_TST_FAIL_FUNCTION_DESC_SMALL;
   }

   if( i == 1000000 )
   {
      printf( "TA_FunctionDescriptionXML failed. Size too large (missing null?).\n" );
      return TA_ABS_TST_FAIL_FUNCTION_DESC_LARGE;
   }

   return TA_TEST_PASS; /* Succcess. */
}